

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

void __thiscall Shell::Run(Shell *this)

{
  bool bVar1;
  element_type *peVar2;
  string local_70 [32];
  undefined1 local_50 [8];
  CommandSptr cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string s;
  Shell *this_local;
  
  do {
    std::operator<<((ostream *)&std::cout,this->path);
    std::operator<<((ostream *)&std::cout,"$ ");
    GetCommand_abi_cxx11_((Shell *)local_30);
    bVar1 = std::operator==(local_30,"exit");
    if (bVar1) {
      cmd.super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 3;
    }
    else {
      std::__cxx11::string::string(local_70,(string *)local_30);
      CmdParser::Parse((CmdParser *)local_50,(string *)this);
      std::__cxx11::string::~string(local_70);
      bVar1 = std::operator!=((shared_ptr<Command> *)local_50,(nullptr_t)0x0);
      if (bVar1) {
        peVar2 = std::__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
        (**peVar2->_vptr_Command)();
      }
      std::shared_ptr<Command>::~shared_ptr((shared_ptr<Command> *)local_50);
      cmd.super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_30);
  } while ((int)cmd.super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi == 0);
  return;
}

Assistant:

void Shell::Run(){
	while(true){
		cout << path;
		cout << "$ ";
		auto s = GetCommand();
		if(s == "exit")break;
		auto cmd = cmdPsr.Parse(s);
		if(cmd != nullptr)cmd->Execute();
	}
}